

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

void __thiscall
capnp::UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
          (UnalignedFlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,
          ReaderOptions options)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  uint uVar5;
  ulong uVar6;
  Exception *pEVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  word *pwVar13;
  ulong uVar14;
  ReaderOptions options_00;
  Fault f;
  Fault local_50;
  ulong local_48;
  undefined8 *local_40;
  Exception *local_38;
  
  uVar11 = array.size_;
  pwVar13 = array.ptr;
  options_00._8_8_ = options._8_8_ & 0xffffffff;
  options_00.traversalLimitInWords = options.traversalLimitInWords;
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_00625be8;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  this->end = pwVar13 + uVar11;
  if (uVar11 != 0) {
    pAVar1 = &this->moreSegments;
    uVar5 = (uint)pwVar13->content;
    uVar14 = (ulong)uVar5;
    uVar5 = uVar5 + 1;
    uVar6 = (ulong)((uVar5 >> 1) + 1);
    if (uVar11 < uVar6) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2b,FAILED,"array.size() >= offset",
                 "\"Message ends prematurely in segment table.\"",
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault(&local_50);
    }
    else {
      uVar9 = (ulong)*(uint *)((long)&pwVar13->content + 4);
      uVar12 = uVar9 + uVar6;
      if (uVar11 < uVar12) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                  (&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x33,FAILED,"array.size() >= offset + segmentSize",
                   "\"Message ends prematurely in first segment.\"",
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&local_50);
      }
      else {
        (this->segment0).ptr = pwVar13 + uVar6;
        (this->segment0).size_ = uVar9;
        if (1 < uVar5) {
          local_50.exception =
               (Exception *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x10,uVar14,uVar14,
                          kj::_::HeapArrayDisposer::
                          Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::construct,
                          kj::_::HeapArrayDisposer::
                          Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::destruct);
          local_40 = &kj::_::HeapArrayDisposer::instance;
          pAVar2 = pAVar1->ptr;
          pEVar7 = local_50.exception;
          local_48 = uVar14;
          if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
            sVar3 = (this->moreSegments).size_;
            pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
            (this->moreSegments).size_ = 0;
            pAVar4 = (this->moreSegments).disposer;
            local_38 = local_50.exception;
            (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pAVar2,0x10,sVar3,sVar3,0);
            pEVar7 = local_38;
          }
          (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)pEVar7;
          (this->moreSegments).size_ = uVar14;
          (this->moreSegments).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          lVar8 = (ulong)uVar5 - 1;
          lVar10 = 0;
          uVar6 = uVar12;
          do {
            uVar14 = (ulong)*(uint *)((long)&pwVar13[1].content + lVar10);
            uVar12 = uVar14 + uVar6;
            if (uVar11 < uVar12) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                        (&local_50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x41,FAILED,"array.size() >= offset + segmentSize",
                         "\"Message ends prematurely.\"",(char (*) [26])"Message ends prematurely.")
              ;
              pAVar2 = pAVar1->ptr;
              if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
                sVar3 = (this->moreSegments).size_;
                pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
                (this->moreSegments).size_ = 0;
                pAVar4 = (this->moreSegments).disposer;
                (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pAVar2,0x10,sVar3,sVar3,0);
              }
              kj::_::Debug::Fault::~Fault(&local_50);
              return;
            }
            pAVar2 = pAVar1->ptr;
            *(word **)((long)&pAVar2->ptr + lVar10 * 4) = pwVar13 + uVar6;
            *(ulong *)((long)&pAVar2->size_ + lVar10 * 4) = uVar14;
            lVar10 = lVar10 + 4;
            lVar8 = lVar8 + -1;
            uVar6 = uVar12;
          } while (lVar8 != 0);
        }
        this->end = pwVar13 + uVar12;
      }
    }
  }
  return;
}

Assistant:

UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}